

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O3

void __thiscall
iutest::detail::
TypeParamTestInstance<iu_StringSplitLvalue_x_iutest_x_chain_at_last_by_stl_str_view_Test,_iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>_>
::EachTest<iutest::detail::VariadicTypeList<char16_t,_char32_t>,_void>::AddTest
          (EachTest<iutest::detail::VariadicTypeList<char16_t,_char32_t>,_void> *this)

{
  TestInfo *pTVar1;
  TestCase *pTVar2;
  value_ptr pTVar3;
  UnitTest *pUVar4;
  node_ptr pTVar5;
  bool bVar6;
  
  pUVar4 = UnitTest::instance();
  pTVar2 = (this->m_mediator).super_iuITestCaseMediator.m_test_case;
  (pUVar4->super_UnitTestImpl).m_total_test_num = (pUVar4->super_UnitTestImpl).m_total_test_num + 1;
  pTVar1 = &this->m_info;
  pTVar5 = (pTVar2->m_testinfos).m_node;
  if (pTVar5 == (node_ptr)0x0) {
    (pTVar2->m_testinfos).m_node = pTVar1;
  }
  else {
    do {
      pTVar3 = (pTVar5->super_iu_list_node<iutest::TestInfo>).next;
      if (pTVar3 == (value_ptr)0x0) {
        (pTVar5->super_iu_list_node<iutest::TestInfo>).next = pTVar1;
        (this->m_info).super_iu_list_node<iutest::TestInfo>.prev = pTVar5;
        break;
      }
      bVar6 = pTVar5 != pTVar1;
      pTVar5 = pTVar3;
    } while (bVar6);
  }
  TypeParamTestInstance<iu_StringSplitLvalue_x_iutest_x_chain_at_last_by_stl_str_view_Test,_iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>_>
  ::EachTest<iutest::detail::VariadicTypeList<char32_t>,_void>::AddTest(&this->m_next);
  return;
}

Assistant:

void AddTest()
        {
            // 順番通りになるように前から登録
            UnitTest::instance().AddTestInfo(m_mediator.ptr(), &m_info);
            m_next.AddTest();
        }